

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result_conflict *
CoreML::validateRankCount
          (Result_conflict *__return_storage_ptr__,NeuralNetworkLayer *layer,string *layerType,
          int min,int max,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *blobNameToRank)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  bool bVar5;
  string *psVar6;
  mapped_type *pmVar7;
  allocator local_111;
  undefined1 local_110 [32];
  Result local_f0;
  iterator iStack_c0;
  int rank_1;
  _Self local_b8;
  allocator local_a9;
  undefined1 local_a8 [32];
  Result local_88;
  iterator iStack_58;
  int rank;
  _Self local_40;
  undefined1 local_31;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *blobNameToRank_local;
  int max_local;
  int min_local;
  string *layerType_local;
  NeuralNetworkLayer *layer_local;
  Result_conflict *r;
  
  local_31 = 0;
  local_30 = blobNameToRank;
  blobNameToRank_local._0_4_ = max;
  blobNameToRank_local._4_4_ = min;
  _max_local = layerType;
  layerType_local = (string *)layer;
  layer_local = (NeuralNetworkLayer *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  pmVar1 = local_30;
  psVar6 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                     ((NeuralNetworkLayer *)layerType_local,0);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar1,(key_type *)psVar6);
  iStack_58 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::end(local_30);
  bVar5 = std::operator!=(&local_40,&stack0xffffffffffffffa8);
  pmVar1 = local_30;
  if (bVar5) {
    psVar6 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                       ((NeuralNetworkLayer *)layerType_local,0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(pmVar1,psVar6);
    psVar4 = layerType_local;
    psVar6 = _max_local;
    iVar3 = blobNameToRank_local._4_4_;
    iVar2 = (int)blobNameToRank_local;
    local_88.m_message._M_storage._M_storage._4_4_ = *pmVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,"input",&local_a9);
    checkRank((Result_conflict *)(local_a8 + 0x20),(NeuralNetworkLayer *)psVar4,psVar6,iVar3,iVar2,
              (string *)local_a8,local_88.m_message._M_storage._M_storage._4_4_);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_a8 + 0x20));
    Result::~Result((Result *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  bVar5 = Result::good((Result *)__return_storage_ptr__);
  pmVar1 = local_30;
  if (bVar5) {
    psVar6 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                       ((NeuralNetworkLayer *)layerType_local,0);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(pmVar1,(key_type *)psVar6);
    iStack_c0 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::end(local_30);
    bVar5 = std::operator!=(&local_b8,&stack0xffffffffffffff40);
    pmVar1 = local_30;
    if (bVar5) {
      psVar6 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                         ((NeuralNetworkLayer *)layerType_local,0);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(pmVar1,psVar6);
      psVar4 = layerType_local;
      psVar6 = _max_local;
      iVar3 = blobNameToRank_local._4_4_;
      iVar2 = (int)blobNameToRank_local;
      local_f0.m_message._M_storage._M_storage._4_4_ = *pmVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_110,"output",&local_111);
      checkRank((Result_conflict *)(local_110 + 0x20),(NeuralNetworkLayer *)psVar4,psVar6,iVar3,
                iVar2,(string *)local_110,local_f0.m_message._M_storage._M_storage._4_4_);
      Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_110 + 0x20));
      Result::~Result((Result *)(local_110 + 0x20));
      std::__cxx11::string::~string((string *)local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRankCount(const Specification::NeuralNetworkLayer& layer,
                                const std::string &layerType, int min, int max,
                                std::map<std::string, int>& blobNameToRank) {
    
    Result r;
    
    // check that 1st input's rank is within permissible limits
    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
        int rank = blobNameToRank.at(layer.input(0));
        r = checkRank(layer, layerType, min, max, "input", rank);
    }
    
    if (!r.good()) {return r;}
    
    // check that 2nd input's rank is within permissible limits
    if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
        int rank = blobNameToRank.at(layer.output(0));
        r = checkRank(layer, layerType, min, max, "output", rank);
    }
    return r;
}